

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteU32Leb128WithReloc
          (BinaryWriter *this,Index index,char *desc,RelocType reloc_type)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  pointer __result;
  pointer pRVar4;
  pointer pRVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  pointer __dest;
  _Tp_alloc_type *__alloc;
  ulong uVar9;
  pointer pRVar10;
  SymbolType SVar11;
  mapped_type mVar12;
  ulong uVar13;
  size_t __n;
  Index IVar14;
  key_type local_80;
  unsigned_long local_60;
  size_t offset;
  RelocType local_4c;
  char *local_48;
  pointer local_40;
  Index local_38;
  SymbolType local_34;
  
  if (this->options_->relocatable != true) {
    WriteU32Leb128(this->stream_,index,desc);
    return;
  }
  local_4c = reloc_type;
  local_38 = index;
  if ((this->current_reloc_section_ == (RelocSection *)0x0) ||
     (this->current_reloc_section_->section_index != this->section_count_)) {
    local_48 = desc;
    local_34 = reloc_type;
    pcVar2 = GetSectionName(this->last_section_type_);
    pRVar5 = (this->reloc_sections_).
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar5 == (this->reloc_sections_).
                  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pRVar10 = (this->reloc_sections_).
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pRVar5 - (long)pRVar10 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar9 = ((long)pRVar5 - (long)pRVar10) / 0x28;
      uVar3 = uVar9;
      if (pRVar5 == pRVar10) {
        uVar3 = 1;
      }
      uVar13 = uVar3 + uVar9;
      if (0x333333333333332 < uVar13) {
        uVar13 = 0x333333333333333;
      }
      if (CARRY8(uVar3,uVar9)) {
        uVar13 = 0x333333333333333;
      }
      if (uVar13 == 0) {
        __result = (pointer)0x0;
      }
      else {
        local_40 = pRVar10;
        __result = (pointer)operator_new(uVar13 * 0x28);
        pRVar10 = local_40;
      }
      uVar1 = this->section_count_;
      __alloc = (_Tp_alloc_type *)(ulong)uVar1;
      __result[uVar9].name = pcVar2;
      __result[uVar9].section_index = uVar1;
      __result[uVar9].relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      __result[uVar9].relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __result[uVar9].relocations.super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar4 = std::
               vector<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ::_S_relocate(pRVar10,pRVar5,__result,__alloc);
      pRVar5 = std::
               vector<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ::_S_relocate(pRVar5,pRVar5,pRVar4 + 1,__alloc);
      if (pRVar10 != (pointer)0x0) {
        operator_delete(pRVar10);
      }
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar5;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar13;
    }
    else {
      IVar14 = this->section_count_;
      pRVar5->name = pcVar2;
      pRVar5->section_index = IVar14;
      (pRVar5->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pRVar5->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pRVar5->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pRVar5 = (this->reloc_sections_).
               super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar5;
    }
    this->current_reloc_section_ = pRVar5 + -1;
    desc = local_48;
    reloc_type = local_34;
  }
  IVar14 = local_38;
  local_60 = this->stream_->offset_ - this->last_section_payload_offset_;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  if (reloc_type == Function) {
    SVar11 = Function;
    std::__cxx11::string::_M_assign
              ((string *)&local_80,
               (string *)
               (this->module_->funcs).
               super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_38]);
  }
  else {
    std::__cxx11::string::_M_assign
              ((string *)&local_80,
               (string *)
               (this->module_->globals).
               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_38]);
    SVar11 = Global;
  }
  iVar6 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->symtab_)._M_h,&local_80);
  if (iVar6.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    mVar12 = (mapped_type)
             (((long)(this->symbols_).
                     super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->symbols_).
                    super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0xc);
    local_34 = SVar11;
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->symtab_,&local_80);
    *pmVar7 = mVar12;
    pRVar5 = (pointer)(this->symbols_).
                      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar5 == (pointer)(this->symbols_).
                           super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pRVar10 = (pointer)(this->symbols_).
                         super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)pRVar5 - (long)pRVar10;
      local_48 = desc;
      if (__n == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      sVar8 = (long)__n / 0xc;
      uVar3 = 1;
      if (pRVar5 != pRVar10) {
        uVar3 = sVar8;
      }
      uVar9 = uVar3 + sVar8;
      if (0xaaaaaaaaaaaaaa9 < uVar9) {
        uVar9 = 0xaaaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar3,sVar8)) {
        uVar9 = 0xaaaaaaaaaaaaaaa;
      }
      local_40 = pRVar10;
      if (uVar9 == 0) {
        __dest = (pointer)0x0;
      }
      else {
        offset = sVar8;
        __dest = (pointer)operator_new(uVar9 * 0xc);
        sVar8 = offset;
      }
      __dest[sVar8].symbol_index = mVar12;
      __dest[sVar8].type = local_34;
      __dest[sVar8].element_index = local_38;
      if (0 < (long)__n) {
        memmove(__dest,local_40,__n);
      }
      if (local_40 != (pointer)0x0) {
        operator_delete(local_40);
      }
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start = __dest;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)__dest + __n + 0xc);
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest + uVar9;
      desc = local_48;
      IVar14 = local_38;
    }
    else {
      *(mapped_type *)&pRVar5->name = mVar12;
      *(SymbolType *)((long)&pRVar5->name + 4) = local_34;
      pRVar5->section_index = local_38;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&pRVar5->field_0xc;
      IVar14 = local_38;
    }
  }
  else {
    mVar12 = *(mapped_type *)
              ((long)iVar6.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                     ._M_cur + 0x28);
  }
  std::__cxx11::string::~string((string *)&local_80);
  local_80._M_dataplus._M_p._0_4_ = mVar12;
  std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
  emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
            ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
             &this->current_reloc_section_->relocations,&local_4c,&local_60,(uint *)&local_80);
  WriteFixedU32Leb128(this->stream_,IVar14,desc);
  return;
}

Assistant:

void BinaryWriter::WriteU32Leb128WithReloc(Index index,
                                           const char* desc,
                                           RelocType reloc_type) {
  if (options_.relocatable) {
    AddReloc(reloc_type, index);
    WriteFixedU32Leb128(stream_, index, desc);
  } else {
    WriteU32Leb128(stream_, index, desc);
  }
}